

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::EntryPointInfo::SetCodeGenRecorded
          (EntryPointInfo *this,JavascriptMethod thunkAddress,JavascriptMethod nativeAddress,
          ptrdiff_t codeSize,void *validationCookie)

{
  code *pcVar1;
  State SVar2;
  bool bVar3;
  undefined4 *puVar4;
  NativeEntryPointData *this_00;
  
  SVar2 = GetState(this);
  if (SVar2 != CodeGenQueued) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2072,"(this->GetState() == CodeGenQueued)",
                                "this->GetState() == CodeGenQueued");
    if (!bVar3) goto LAB_0077d625;
    *puVar4 = 0;
  }
  if (codeSize < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2073,"(codeSize > 0)","codeSize > 0");
    if (!bVar3) {
LAB_0077d625:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = GetNativeEntryPointData(this);
  NativeEntryPointData::RecordNativeCode
            (this_00,thunkAddress,nativeAddress,codeSize,validationCookie);
  this->state = CodeGenRecorded;
  return;
}

Assistant:

void EntryPointInfo::SetCodeGenRecorded(Js::JavascriptMethod thunkAddress, Js::JavascriptMethod nativeAddress, ptrdiff_t codeSize, void * validationCookie)
    {
        Assert(this->GetState() == CodeGenQueued);
        Assert(codeSize > 0);
        this->GetNativeEntryPointData()->RecordNativeCode(thunkAddress, nativeAddress, codeSize, validationCookie);
        this->state = CodeGenRecorded;

#ifdef PERF_COUNTERS
        this->OnRecorded();
#endif
    }